

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zMaster)

{
  int *piVar1;
  BtShared *pBt;
  Pager *pPager;
  sqlite3_mutex *psVar2;
  u8 *puVar3;
  uint uVar4;
  Pgno nFin;
  int iVar5;
  undefined8 uVar6;
  BtCursor *pBVar7;
  uint nOrig;
  bool bVar8;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (pBt->autoVacuum != '\0') {
    pPager = pBt->pPager;
    for (pBVar7 = pBt->pCursor; pBVar7 != (BtCursor *)0x0; pBVar7 = pBVar7->pNext) {
      sqlite3_free(pBVar7->aOverflow);
      pBVar7->aOverflow = (Pgno *)0x0;
    }
    iVar5 = 0;
    if (pBt->incrVacuum == '\0') {
      nOrig = pBt->nPage;
      uVar4 = 0;
      if (1 < nOrig) {
        iVar5 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
        uVar4 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      if ((uVar4 == nOrig) || (nOrig == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        uVar6 = 0xcdfe;
      }
      else {
        uVar4 = *(uint *)(pBt->pPage1->aData + 0x24);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        nFin = finalDbSize(pBt,nOrig,uVar4);
        if (nFin <= nOrig) {
          iVar5 = 0;
          if (nFin < nOrig) {
            iVar5 = saveAllCursors(pBt,0,(BtCursor *)0x0);
          }
          bVar8 = iVar5 == 0;
          if (nFin < nOrig && bVar8) {
            do {
              iVar5 = incrVacuumStep(pBt,nFin,nOrig,1);
              nOrig = nOrig - 1;
              bVar8 = iVar5 == 0;
              if (nOrig <= nFin) break;
            } while (iVar5 == 0);
          }
          if ((uVar4 != 0) && ((bool)(iVar5 == 0x65 | bVar8))) {
            iVar5 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            puVar3 = pBt->pPage1->aData;
            puVar3[0x20] = '\0';
            puVar3[0x21] = '\0';
            puVar3[0x22] = '\0';
            puVar3[0x23] = '\0';
            puVar3 = pBt->pPage1->aData;
            puVar3[0x24] = '\0';
            puVar3[0x25] = '\0';
            puVar3[0x26] = '\0';
            puVar3[0x27] = '\0';
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 nFin >> 0x18 | (nFin & 0xff0000) >> 8 | (nFin & 0xff00) << 8 | nFin << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = nFin;
          }
          if (iVar5 != 0) {
            sqlite3PagerRollback(pPager);
          }
          goto LAB_0014c25d;
        }
        uVar6 = 0xce03;
      }
      iVar5 = 0xb;
      sqlite3_log(0xb,"database corruption at line %d of [%.10s]",uVar6,
                  "118a3b35693b134d56ebd780123b7fd6f1497668");
    }
LAB_0014c25d:
    if (iVar5 != 0) goto LAB_0014c281;
  }
  if (pBt->bDoTruncate != '\0') {
    pBt->pPager->dbSize = pBt->nPage;
  }
  iVar5 = sqlite3PagerCommitPhaseOne(pBt->pPager,zMaster,0);
LAB_0014c281:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      psVar2 = p->pBt->mutex;
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      }
      p->locked = '\0';
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zMaster){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(pBt);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zMaster, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}